

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices
          (TessellationShaderPointsVerification *this,_run *run,void *run_data,uint run_n_vertices)

{
  ostringstream *this_00;
  MessageBuilder *this_01;
  TestError *this_02;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  string vertex_spacing;
  pointer local_1c0;
  string local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  if (run_n_vertices != 0) {
    iVar1 = run_n_vertices - 1;
    uVar2 = 3;
    iVar5 = 0;
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      if (uVar4 < run_n_vertices) {
        uVar3 = (ulong)(uint)((int)uVar3 * 3);
        uVar7 = uVar2;
        iVar6 = iVar1;
        do {
          uVar8 = (ulong)uVar7;
          fVar9 = *(float *)((long)run_data + uVar3 * 4) - *(float *)((long)run_data + uVar8 * 4);
          fVar10 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar10 = fVar9;
          }
          if (fVar10 < 1e-05) {
            fVar9 = *(float *)((long)run_data + uVar3 * 4 + 4) -
                    *(float *)((long)run_data + uVar8 * 4 + 4);
            fVar10 = -fVar9;
            if (-fVar9 <= fVar9) {
              fVar10 = fVar9;
            }
            if (fVar10 < 1e-05) {
              fVar9 = *(float *)((long)run_data + uVar3 * 4 + 8) -
                      *(float *)((long)run_data + uVar8 * 4 + 8);
              fVar10 = -fVar9;
              if (-fVar9 <= fVar9) {
                fVar10 = fVar9;
              }
              if (fVar10 < 1e-05) {
                iVar5 = iVar5 + 1;
              }
            }
          }
          uVar7 = uVar7 + 3;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar2 = uVar2 + 3;
      iVar1 = iVar1 + -1;
      uVar3 = uVar4;
    } while (uVar4 != run_n_vertices);
    if (iVar5 != 0) {
      TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                (&local_1b8,(TessellationShaderUtils *)(ulong)run->vertex_spacing,
                 (_tessellation_shader_vertex_spacing)run_data);
      local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "Duplicate vertices found for the following tesselelation configuration: tessellation level:["
                 ,0x5c);
      std::ostream::_M_insert<double>((double)run->inner[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)run->inner[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"], outer tessellation level: [",0x1e);
      std::ostream::_M_insert<double>((double)run->outer[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)run->outer[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)run->outer[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)run->outer[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"vertex spacing mode:[",0x15);
      local_1c0 = local_1b8._M_dataplus._M_p;
      this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_120);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Duplicate vertex found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                 ,0x419);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices(const _run& run, const void* run_data,
																				  unsigned int run_n_vertices)
{
	const float  epsilon			  = 1e-5f;
	unsigned int n_duplicate_vertices = 0;

	for (unsigned int n_vertex_a = 0; n_vertex_a < run_n_vertices; ++n_vertex_a)
	{
		const float* vertex_a = (const float*)run_data + n_vertex_a * 3; /* components */

		for (unsigned int n_vertex_b = n_vertex_a + 1; n_vertex_b < run_n_vertices; ++n_vertex_b)
		{
			const float* vertex_b = (const float*)run_data + n_vertex_b * 3; /* components */

			if (de::abs(vertex_a[0] - vertex_b[0]) < epsilon && de::abs(vertex_a[1] - vertex_b[1]) < epsilon &&
				de::abs(vertex_a[2] - vertex_b[2]) < epsilon)
			{
				n_duplicate_vertices++;
			}
		} /* for (all vertices) */
	}	 /* for (all vertices) */

	if (n_duplicate_vertices != 0)
	{
		std::string vertex_spacing = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

		m_testCtx.getLog() << tcu::TestLog::Message << "Duplicate vertices found for the following tesselelation"
													   " configuration: tessellation level:"
													   "["
						   << run.inner[0] << ", " << run.inner[1] << "], "
																	  "outer tessellation level:"
																	  " ["
						   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", " << run.outer[3]
						   << "], "
						   << "vertex spacing mode:[" << vertex_spacing.c_str() << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Duplicate vertex found");
	}
}